

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab_r::tab_r(tab_r *this,brdf *fr,int resolution)

{
  int iVar1;
  undefined4 extraout_var;
  int in_ECX;
  undefined4 in_register_00000014;
  void *in_R8;
  ideal<1> local_28;
  
  local_28.super_impl._vptr_impl = (impl)&PTR_clone_001fbad8;
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f1d00;
  iVar1 = fresnel::ideal<1>::clone
                    (&local_28,(__fn *)fr,(void *)CONCAT44(in_register_00000014,resolution),in_ECX,
                     in_R8);
  (this->super_radial).super_microfacet.m_fresnel.m_f = (impl *)CONCAT44(extraout_var,iVar1);
  (this->super_radial).super_microfacet.super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f1d80;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&this->m_ndf,(long)resolution);
  extract_ndf(this,fr,resolution);
  configure(this);
  return;
}

Assistant:

tab_r::tab_r(const brdf &fr, int resolution):
	radial(fresnel::ideal<1>())
{
	m_ndf.reserve(resolution);
	extract_ndf(fr, resolution);
	configure();
}